

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O2

int __thiscall llama_context::encode(llama_context *this,llama_batch *inp_batch)

{
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *this_00;
  bool bVar1;
  pointer piVar2;
  long lVar3;
  pointer __dest;
  float *__src;
  llama_batch in_batch;
  llama_pos lVar4;
  uint32_t uVar5;
  int32_t iVar6;
  ggml_status gVar7;
  int64_t iVar8;
  llama_ubatch *ubatch_00;
  long lVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  size_t __n;
  char *pcVar12;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  *this_01;
  undefined8 uVar13;
  int32_t i_1;
  ulong uVar14;
  int32_t i;
  ulong uVar15;
  llama_model *n_embd;
  int s;
  uint uVar16;
  int iVar17;
  size_t n_ubatch;
  llama_seq_id seq_id;
  llama_model *local_178;
  undefined1 local_170 [56];
  float *local_138;
  llama_pos *plStack_130;
  int32_t *local_128;
  llama_seq_id **pplStack_120;
  int8_t *local_118;
  llama_ubatch ubatch;
  llama_batch_allocr batch_allocr;
  
  if (inp_batch->n_tokens == 0) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: n_tokens == 0\n","encode");
    return -1;
  }
  local_118 = inp_batch->logits;
  local_170._40_4_ = inp_batch->n_tokens;
  local_170._44_4_ = *(float *)&inp_batch->field_0x4;
  local_170._48_8_ = inp_batch->token;
  local_138 = inp_batch->embd;
  plStack_130 = inp_batch->pos;
  local_128 = inp_batch->n_seq_id;
  pplStack_120 = inp_batch->seq_id;
  if (inp_batch->pos == (llama_pos *)0x0) {
    lVar4 = llama_kv_cache_unified::pos_max
                      ((this->kv_self)._M_t.
                       super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                       .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl);
    lVar4 = lVar4 + 1;
  }
  else {
    lVar4 = -1;
  }
  in_batch.token = (llama_token *)local_170._48_8_;
  in_batch._0_8_ = local_170._40_8_;
  in_batch.embd = local_138;
  in_batch.pos = plStack_130;
  in_batch.n_seq_id = local_128;
  in_batch.seq_id = pplStack_120;
  in_batch.logits = local_118;
  llama_batch_allocr::llama_batch_allocr(&batch_allocr,in_batch,lVar4);
  local_178 = this->model;
  if (batch_allocr.batch.embd == (float *)0x0 || batch_allocr.batch.token != (llama_token *)0x0) {
    pcVar12 = "(!batch.token && batch.embd) || (batch.token && !batch.embd)";
    uVar13 = 0x40f;
    if ((batch_allocr.batch.token == (llama_token *)0x0) ||
       (batch_allocr.batch.embd != (float *)0x0)) goto LAB_001d3ccd;
    uVar15 = 0;
    uVar14 = 0;
    if (0 < batch_allocr.batch.n_tokens) {
      uVar14 = (ulong)(uint)batch_allocr.batch.n_tokens;
    }
    for (; uVar14 != uVar15; uVar15 = uVar15 + 1) {
      uVar16 = batch_allocr.batch.token[uVar15];
      if ((int)uVar16 < 0) {
LAB_001d3a10:
        llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: invalid token[%d] = %d\n","encode",
                           uVar15 & 0xffffffff,(ulong)uVar16);
        iVar17 = -1;
        goto LAB_001d3b82;
      }
      uVar5 = llama_vocab::n_tokens(&this->model->vocab);
      if (uVar5 <= uVar16) {
        uVar16 = batch_allocr.batch.token[uVar15];
        goto LAB_001d3a10;
      }
    }
  }
  if ((this->cparams).n_ubatch < (uint)batch_allocr.batch.n_tokens) {
    pcVar12 = "cparams.n_ubatch >= (uint32_t) n_tokens && \"encoder requires n_ubatch >= n_tokens\""
    ;
    uVar13 = 0x41b;
LAB_001d3ccd:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
               ,uVar13,"GGML_ASSERT(%s) failed",pcVar12);
  }
  if (this->t_compute_start_us == 0) {
    iVar8 = ggml_time_us();
    this->t_compute_start_us = iVar8;
  }
  n_ubatch = (size_t)batch_allocr.batch.n_tokens;
  this->n_queued_tokens = this->n_queued_tokens + n_ubatch;
  n_embd = (llama_model *)(ulong)(local_178->hparams).n_embd;
  llama_sbatch::from_batch(&this->sbatch,&batch_allocr.batch,(size_t)n_embd,true,true);
  llama_sbatch::split_simple(&ubatch,&this->sbatch,n_ubatch);
  iVar6 = output_reserve(this,batch_allocr.batch.n_tokens);
  if (iVar6 < batch_allocr.batch.n_tokens) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,
                       "%s: could not reserve space for batch with %u outputs\n","encode",
                       (ulong)(uint)batch_allocr.batch.n_tokens);
    iVar17 = -2;
    goto LAB_001d3b82;
  }
  piVar2 = (this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = 0;
  uVar15 = 0;
  if (0 < batch_allocr.batch.n_tokens) {
    uVar15 = (ulong)(uint)batch_allocr.batch.n_tokens;
  }
  for (; uVar15 != uVar14; uVar14 = uVar14 + 1) {
    piVar2[uVar14] = (int)uVar14;
  }
  this->n_outputs = batch_allocr.batch.n_tokens;
  ggml_backend_sched_reset
            ((this->sched)._M_t.
             super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
  ggml_backend_sched_set_eval_callback
            ((this->sched)._M_t.
             super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,(this->cparams).cb_eval
             ,(this->cparams).cb_eval_user_data);
  bVar1 = (this->cparams).causal_attn;
  (this->cparams).causal_attn = false;
  local_178 = n_embd;
  ubatch_00 = (llama_ubatch *)graph_init(this);
  graph_build((llama_context *)local_170,(ggml_context *)this,
              (ggml_cgraph *)
              (this->ctx_compute)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>.
              _M_t.super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
              super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,ubatch_00,
              (llm_graph_type)&ubatch);
  ggml_backend_sched_alloc_graph
            ((this->sched)._M_t.
             super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,ubatch_00);
  (**(code **)(*(long *)local_170._0_8_ + 0x28))(local_170._0_8_,&ubatch);
  (this->cparams).causal_attn = bVar1;
  gVar7 = graph_compute(this,(ggml_cgraph *)ubatch_00,1 < batch_allocr.batch.n_tokens);
  if (gVar7 == GGML_STATUS_ALLOC_FAILED) {
    iVar17 = -2;
    goto LAB_001d3b72;
  }
  if (gVar7 != GGML_STATUS_SUCCESS) {
    if (gVar7 == GGML_STATUS_ABORTED) {
      iVar17 = 2;
    }
    else {
      iVar17 = -3;
    }
    goto LAB_001d3b72;
  }
  local_170._24_8_ = n_ubatch;
  lVar9 = (**(code **)(*(long *)local_170._0_8_ + 0x20))();
  local_170._8_8_ = (**(code **)(*(long *)local_170._0_8_ + 0x18 + (ulong)(lVar9 != 0) * 8))();
  if (local_170._8_8_ == 0) goto switchD_001d3ab7_default;
  local_170._16_8_ =
       ggml_backend_sched_get_tensor_backend
                 ((this->sched)._M_t.
                  super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                  super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                  super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,local_170._8_8_);
  if (local_170._16_8_ == 0) {
    pcVar12 = "backend_embd != nullptr";
    uVar13 = 0x45c;
LAB_001d3cfc:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
               ,uVar13,"GGML_ASSERT(%s) failed",pcVar12);
  }
  if (this->embd == (float *)0x0) {
    pcVar12 = "embd != nullptr";
    uVar13 = 0x45e;
    goto LAB_001d3cfc;
  }
  switch((this->cparams).pooling_type) {
  case LLAMA_POOLING_TYPE_NONE:
    lVar9 = (long)local_178 * local_170._24_8_;
    if (lVar9 - this->embd_size != 0 && (long)this->embd_size <= lVar9) {
      pcVar12 = "n_tokens*n_embd <= (int64_t) embd_size";
      uVar13 = 0x464;
      goto LAB_001d3cfc;
    }
    ggml_backend_tensor_get_async(local_170._16_8_,local_170._8_8_,this->embd,0,lVar9 * 4);
    break;
  case LLAMA_POOLING_TYPE_MEAN:
  case LLAMA_POOLING_TYPE_CLS:
  case LLAMA_POOLING_TYPE_LAST:
    this_00 = &this->embd_seq;
    std::
    _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::clear(&this_00->_M_t);
    if (ubatch.equal_seqs != false) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                 ,0x46f,"GGML_ASSERT(%s) failed","!ubatch.equal_seqs");
    }
    local_170._32_8_ = (long)local_178 * 4;
    for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
      seq_id = *ubatch.seq_id[uVar14];
      iVar10 = std::
               _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::find(&this_00->_M_t,&seq_id);
      if ((_Rb_tree_header *)iVar10._M_node == &(this->embd_seq)._M_t._M_impl.super__Rb_tree_header)
      {
        pmVar11 = std::
                  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator[](this_00,&seq_id);
        std::vector<float,_std::allocator<float>_>::resize(pmVar11,(size_type)local_178);
        pmVar11 = std::
                  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                  ::operator[](this_00,&seq_id);
        ggml_backend_tensor_get_async
                  (local_170._16_8_,local_170._8_8_,
                   (pmVar11->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start,(long)seq_id * local_170._32_8_);
      }
    }
    break;
  case LLAMA_POOLING_TYPE_RANK:
    pcVar12 = "RANK pooling not implemented yet";
    uVar13 = 0x47f;
LAB_001d3d4c:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
               ,uVar13,pcVar12);
  case LLAMA_POOLING_TYPE_UNSPECIFIED:
    pcVar12 = "unknown pooling type";
    uVar13 = 0x483;
    goto LAB_001d3d4c;
  }
switchD_001d3ab7_default:
  ggml_backend_sched_reset
            ((this->sched)._M_t.
             super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
             super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
             super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
  uVar13 = local_170._8_8_;
  iVar17 = 0;
  if ((local_170._8_8_ != 0) && (this->model->arch == LLM_ARCH_T5)) {
    synchronize(this);
    lVar9 = *(long *)(uVar13 + 0x10);
    (this->cross).n_embd = lVar9;
    lVar3 = *(long *)(uVar13 + 0x18);
    (this->cross).n_enc = lVar3;
    std::vector<float,_std::allocator<float>_>::resize(&(this->cross).v_embd,lVar3 * lVar9);
    __dest = (this->cross).v_embd.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    __src = this->embd;
    __n = ggml_nbytes(uVar13);
    memcpy(__dest,__src,__n);
    this_01 = &(this->cross).seq_ids_enc;
    std::
    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
    ::resize(this_01,local_170._24_8_);
    for (uVar14 = 0; uVar14 != uVar15; uVar14 = uVar14 + 1) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                (&(this_01->
                  super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar14]._M_t);
      for (lVar9 = 0; lVar9 < ubatch.n_seq_id[uVar14]; lVar9 = lVar9 + 1) {
        seq_id = ubatch.seq_id[uVar14][lVar9];
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   ((this_01->
                    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar14),&seq_id);
      }
    }
    iVar17 = 0;
  }
LAB_001d3b72:
  if ((llama_model *)local_170._0_8_ != (llama_model *)0x0) {
    (**(code **)(*(long *)local_170._0_8_ + 8))();
  }
LAB_001d3b82:
  llama_batch_allocr::~llama_batch_allocr(&batch_allocr);
  return iVar17;
}

Assistant:

int llama_context::encode(llama_batch & inp_batch) {
    if (inp_batch.n_tokens == 0) {
        LLAMA_LOG_ERROR("%s: n_tokens == 0\n", __func__);
        return -1;
    }

    // temporary allocate memory for the input batch if needed
    // TODO: this is incorrect for multiple sequences because pos_max() is the maximum across all sequences
    llama_batch_allocr batch_allocr(inp_batch, inp_batch.pos ? -1 : kv_self->pos_max() + 1);

    const llama_batch & batch = batch_allocr.batch;
    const int32_t n_tokens = batch.n_tokens;

    const auto & hparams = model.hparams;

    GGML_ASSERT((!batch.token && batch.embd) || (batch.token && !batch.embd)); // NOLINT

    if (batch.token) {
        for (int32_t i = 0; i < n_tokens; ++i) {
            if (batch.token[i] < 0 || (uint32_t) batch.token[i] >= model.vocab.n_tokens()) {
                LLAMA_LOG_ERROR("%s: invalid token[%d] = %d\n", __func__, i, batch.token[i]);
                return -1;
            }
        }
    }

    // micro-batching is not possible for non-causal encoding, so we process the batch in a single shot
    GGML_ASSERT(cparams.n_ubatch >= (uint32_t) n_tokens && "encoder requires n_ubatch >= n_tokens");

    if (t_compute_start_us == 0) {
        t_compute_start_us = ggml_time_us();
    }

    n_queued_tokens += n_tokens;

    const int64_t n_embd = hparams.n_embd;

    sbatch.from_batch(batch, n_embd, /* simple_split */ true, /* logits_all */ true);

    const llama_ubatch ubatch = sbatch.split_simple(n_tokens);

    // reserve output buffer
    if (output_reserve(n_tokens) < n_tokens) {
        LLAMA_LOG_ERROR("%s: could not reserve space for batch with %u outputs\n", __func__, n_tokens);
        return -2;
    };

    for (int32_t i = 0; i < n_tokens; ++i) {
        output_ids[i] = i;
    }

    n_outputs = n_tokens;

    //batch_manager->prepare(ubatch);

    ggml_backend_sched_reset(sched.get());
    ggml_backend_sched_set_eval_callback(sched.get(), cparams.cb_eval, cparams.cb_eval_user_data);

    const auto causal_attn_org = cparams.causal_attn;

    // always use non-causal attention for encoder graphs
    // TODO: this is a tmp solution until we have a proper way to support enc-dec models
    //       ref: https://github.com/ggml-org/llama.cpp/pull/12181#issuecomment-2730451223
    cparams.causal_attn = false;

    auto * gf = graph_init();
    auto res = graph_build(ctx_compute.get(), gf, ubatch, LLM_GRAPH_TYPE_ENCODER);

    ggml_backend_sched_alloc_graph(sched.get(), gf);

    res->set_inputs(&ubatch);

    cparams.causal_attn = causal_attn_org;

    const auto compute_status = graph_compute(gf, n_tokens > 1);
    switch (compute_status) {
        case GGML_STATUS_SUCCESS:
            break;
        case GGML_STATUS_ABORTED:
            return 2;
        case GGML_STATUS_ALLOC_FAILED:
            return -2;
        case GGML_STATUS_FAILED:
        default:
            return -3;
    }

    auto * t_embd = res->get_embd_pooled() ? res->get_embd_pooled() : res->get_embd();

    // extract embeddings
    if (t_embd) {
        ggml_backend_t backend_embd = ggml_backend_sched_get_tensor_backend(sched.get(), t_embd);
        GGML_ASSERT(backend_embd != nullptr);

        GGML_ASSERT(embd != nullptr);

        switch (cparams.pooling_type) {
            case LLAMA_POOLING_TYPE_NONE:
                {
                    // extract token embeddings
                    GGML_ASSERT(n_tokens*n_embd <= (int64_t) embd_size);
                    ggml_backend_tensor_get_async(backend_embd, t_embd, embd, 0, n_tokens*n_embd*sizeof(float));
                } break;
            case LLAMA_POOLING_TYPE_MEAN:
            case LLAMA_POOLING_TYPE_CLS:
            case LLAMA_POOLING_TYPE_LAST:
                {
                    // extract sequence embeddings
                    auto & embd_seq_out = embd_seq;
                    embd_seq_out.clear();

                    GGML_ASSERT(!ubatch.equal_seqs); // TODO: handle equal splits

                    for (int32_t i = 0; i < n_tokens; i++) {
                        const llama_seq_id seq_id = ubatch.seq_id[i][0];
                        if (embd_seq_out.find(seq_id) != embd_seq_out.end()) {
                            continue;
                        }
                        embd_seq_out[seq_id].resize(n_embd);
                        ggml_backend_tensor_get_async(backend_embd, t_embd, embd_seq_out[seq_id].data(), (n_embd*seq_id)*sizeof(float), n_embd*sizeof(float));
                    }
                } break;
            case LLAMA_POOLING_TYPE_RANK:
                {
                    // TODO: this likely should be the same logic as in llama_decoder_internal, but better to
                    //       wait for an encoder model that requires this pooling type in order to test it
                    //       https://github.com/ggerganov/llama.cpp/pull/9510
                    GGML_ABORT("RANK pooling not implemented yet");
                }
            case LLAMA_POOLING_TYPE_UNSPECIFIED:
                {
                    GGML_ABORT("unknown pooling type");
                }
        }
    }

    // Reset state for the next token before backend sync, to allow the CPU activities in the reset to
    // overlap with device computation.
    ggml_backend_sched_reset(sched.get());

    // TODO: hacky solution
    if (model.arch == LLM_ARCH_T5 && t_embd) {
        //cross.t_embd = t_embd;

        synchronize();

        cross.n_embd = t_embd->ne[0];
        cross.n_enc  = t_embd->ne[1];
        cross.v_embd.resize(cross.n_embd*cross.n_enc);
        memcpy(cross.v_embd.data(), embd, ggml_nbytes(t_embd));

        // remember the sequence ids used during the encoding - needed for cross attention later
        cross.seq_ids_enc.resize(n_tokens);
        for (int32_t i = 0; i < n_tokens; i++) {
            cross.seq_ids_enc[i].clear();
            for (int s = 0; s < ubatch.n_seq_id[i]; s++) {
                llama_seq_id seq_id = ubatch.seq_id[i][s];
                cross.seq_ids_enc[i].insert(seq_id);
            }
        }
    }

    return 0;
}